

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
protozero::Message::Reset(Message *this,ScatteredStreamWriter *stream_writer,MessageArena *arena)

{
  this->stream_writer_ = stream_writer;
  this->arena_ = arena;
  this->nested_message_ = (Message *)0x0;
  this->size_field_ = (uint8_t *)0x0;
  *(undefined8 *)((long)&this->size_field_ + 1) = 0;
  *(undefined8 *)((long)&this->size_ + 1) = 0;
  return;
}

Assistant:

void Message::Reset(ScatteredStreamWriter* stream_writer, MessageArena* arena) {
// Older versions of libstdcxx don't have is_trivially_constructible.
#if !defined(__GLIBCXX__) || __GLIBCXX__ >= 20170516
  static_assert(std::is_trivially_constructible<Message>::value,
                "Message must be trivially constructible");
#endif

  static_assert(std::is_trivially_destructible<Message>::value,
                "Message must be trivially destructible");
  stream_writer_ = stream_writer;
  arena_ = arena;
  size_ = 0;
  size_field_ = nullptr;
  size_already_written_ = 0;
  nested_message_ = nullptr;
  finalized_ = false;
#if PERFETTO_DCHECK_IS_ON()
  handle_ = nullptr;
  generation_ = g_generation.fetch_add(1, std::memory_order_relaxed);
#endif
}